

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O3

Id __thiscall spv::Builder::createUndefined(Builder *this,Id type)

{
  Block *pBVar1;
  Id IVar2;
  Instruction *instruction;
  Instruction *raw_instruction;
  _Head_base<0UL,_spv::Instruction_*,_false> local_20;
  
  instruction = (Instruction *)::dxil_spv::allocate_in_thread(0x38);
  IVar2 = this->uniqueId + 1;
  this->uniqueId = IVar2;
  instruction->_vptr_Instruction = (_func_int **)&PTR__Instruction_001f31e0;
  instruction->resultId = IVar2;
  instruction->typeId = type;
  instruction->opCode = OpUndef;
  (instruction->operands).
  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (instruction->operands).
  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (instruction->operands).
  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  instruction->block = (Block *)0x0;
  pBVar1 = this->buildPoint;
  local_20._M_head_impl = instruction;
  std::
  vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
  ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
            ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
              *)&pBVar1->instructions,
             (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_20);
  instruction->block = pBVar1;
  if (instruction->resultId != 0) {
    Module::mapInstruction(pBVar1->parent->parent,instruction);
  }
  if (local_20._M_head_impl != (Instruction *)0x0) {
    (*(local_20._M_head_impl)->_vptr_Instruction[1])();
  }
  return instruction->resultId;
}

Assistant:

Id Builder::createUndefined(Id type)
{
  Instruction* inst = new Instruction(getUniqueId(), type, OpUndef);
  buildPoint->addInstruction(std::unique_ptr<Instruction>(inst));
  return inst->getResultId();
}